

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O0

int __thiscall
soul::Optimisations::Inliner::clone
          (Inliner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *this_00;
  Expression *pEVar1;
  mapped_type *pmVar2;
  Block *args_1;
  Block *args_2;
  BranchIf *pBVar3;
  BranchIf *old_local;
  Inliner *this_local;
  
  this_00 = this->module;
  pEVar1 = pool_ref::operator_cast_to_Expression_((pool_ref *)(__fn + 0x18));
  pEVar1 = cloneExpression(this,pEVar1);
  pmVar2 = std::
           unordered_map<soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>,_std::hash<soul::pool_ref<soul::heart::Block>_>,_std::equal_to<soul::pool_ref<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>_>
           ::operator[](&this->remappedBlocks,(key_type *)(__fn + 0x20));
  args_1 = pool_ptr<soul::heart::Block>::operator*(pmVar2);
  pmVar2 = std::
           unordered_map<soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>,_std::hash<soul::pool_ref<soul::heart::Block>_>,_std::equal_to<soul::pool_ref<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>_>
           ::operator[](&this->remappedBlocks,(key_type *)(__fn + 0x28));
  args_2 = pool_ptr<soul::heart::Block>::operator*(pmVar2);
  pBVar3 = Module::
           allocate<soul::heart::BranchIf,soul::heart::Expression&,soul::heart::Block&,soul::heart::Block&>
                     (this_00,pEVar1,args_1,args_2);
  return (int)pBVar3;
}

Assistant:

heart::BranchIf& clone (const heart::BranchIf& old)
        {
            return module.allocate<heart::BranchIf> (cloneExpression (old.condition),
                                                     *remappedBlocks[old.targets[0]],
                                                     *remappedBlocks[old.targets[1]]);
        }